

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O1

void __thiscall CompilerContext::compile_repeat(CompilerContext *this,SyntaxTree *repeat_node)

{
  _Rb_tree_header *p_Var1;
  vector<CompiledData,_std::allocator<CompiledData>_> *this_00;
  pointer psVar2;
  element_type *peVar3;
  Command *pCVar4;
  RepeatAnnotation *pRVar5;
  LoopInfo *__p;
  long lVar6;
  initializer_list<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
  __l;
  initializer_list<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
  __l_00;
  initializer_list<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
  __l_01;
  initializer_list<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
  __l_02;
  shared_ptr<Label> loop_ptr;
  shared_ptr<Label> break_ptr;
  shared_ptr<Label> continue_ptr;
  allocator_type local_179;
  element_type *local_178;
  undefined1 local_170 [24];
  SymTable *local_158;
  undefined1 local_150 [24];
  SymTable *local_138;
  shared_ptr<Label> local_130;
  shared_ptr<Label> local_120;
  element_type *local_110;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_108;
  anon_union_48_3_1618c560_for__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false>_3
  local_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d0;
  ArgVariant local_c8;
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  local_90;
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  local_78;
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  local_60;
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  local_48;
  
  pRVar5 = SyntaxTree::annotation<RepeatAnnotation_const&>(repeat_node);
  psVar2 = (repeat_node->childs).
           super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar3 = (psVar2->super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_178 = psVar2[1].super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  make_internal_label((CompilerContext *)local_150);
  make_internal_label((CompilerContext *)(local_170 + 0x10));
  make_internal_label((CompilerContext *)local_170);
  local_100._0_8_ = local_150._0_8_;
  local_100._8_8_ = local_150._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_150._8_8_ + 8) = *(_Atomic_word *)(local_150._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_150._8_8_ + 8) = *(_Atomic_word *)(local_150._8_8_ + 8) + 1;
    }
  }
  local_110 = (element_type *)&this->loop_stack;
  local_100._16_8_ = local_170._16_8_;
  local_100._24_8_ = local_158;
  if (local_158 != (SymTable *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_158->scripts)._M_t._M_impl.super__Rb_tree_header;
      (p_Var1->_M_header)._M_color = (p_Var1->_M_header)._M_color + 1;
      UNLOCK();
    }
    else {
      p_Var1 = &(local_158->scripts)._M_t._M_impl.super__Rb_tree_header;
      (p_Var1->_M_header)._M_color = (p_Var1->_M_header)._M_color + 1;
    }
  }
  std::vector<CompilerContext::LoopInfo,_std::allocator<CompilerContext::LoopInfo>_>::
  emplace_back<CompilerContext::LoopInfo>
            ((vector<CompilerContext::LoopInfo,_std::allocator<CompilerContext::LoopInfo>_> *)
             local_110,(LoopInfo *)&local_100._tail);
  if ((SymTable *)local_100._24_8_ != (SymTable *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._24_8_);
  }
  local_108._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar3;
  if ((Commands *)local_100._8_8_ != (Commands *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_);
  }
  pCVar4 = pRVar5->set_var_to_zero;
  get_arg((ArgVariant *)&local_100._tail,this,local_178);
  get_arg(&local_c8,this,&pRVar5->number_zero);
  __l._M_len = 2;
  __l._M_array = (iterator)&local_100;
  std::
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  ::vector(&local_48,__l,&local_179);
  compile_command(this,pCVar4,&local_48,false);
  std::
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  ::~vector(&local_48);
  lVar6 = 0x38;
  do {
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
    ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
                *)((long)&local_100 + lVar6));
    lVar6 = lVar6 + -0x38;
  } while (lVar6 != -0x38);
  local_120.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_170._0_8_;
  local_120.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_;
  if ((Commands *)local_170._8_8_ != (Commands *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (((_Rb_tree_header *)(local_170._8_8_ + 8))->_M_header)._M_color =
           (((_Rb_tree_header *)(local_170._8_8_ + 8))->_M_header)._M_color + 1;
      UNLOCK();
    }
    else {
      (((_Rb_tree_header *)(local_170._8_8_ + 8))->_M_header)._M_color =
           (((_Rb_tree_header *)(local_170._8_8_ + 8))->_M_header)._M_color + 1;
    }
  }
  this_00 = &this->compiled;
  std::vector<CompiledData,std::allocator<CompiledData>>::emplace_back<std::shared_ptr<Label>>
            ((vector<CompiledData,std::allocator<CompiledData>> *)this_00,&local_120);
  if ((Commands *)local_120.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (Commands *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_120.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  compile_statements(this,(repeat_node->childs).
                          super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].
                          super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_130.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_150._0_8_;
  local_130.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_150._8_8_ + 8) = *(_Atomic_word *)(local_150._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_150._8_8_ + 8) = *(_Atomic_word *)(local_150._8_8_ + 8) + 1;
    }
  }
  std::vector<CompiledData,std::allocator<CompiledData>>::emplace_back<std::shared_ptr<Label>>
            ((vector<CompiledData,std::allocator<CompiledData>> *)this_00,&local_130);
  if ((pointer)local_130.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_130.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  pCVar4 = pRVar5->add_var_with_one;
  get_arg((ArgVariant *)&local_100._tail,this,local_178);
  get_arg(&local_c8,this,&pRVar5->number_one);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_100;
  std::
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  ::vector(&local_60,__l_00,&local_179);
  compile_command(this,pCVar4,&local_60,false);
  std::
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  ::~vector(&local_60);
  lVar6 = 0x38;
  do {
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
    ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
                *)((long)&local_100 + lVar6));
    lVar6 = lVar6 + -0x38;
  } while (lVar6 != -0x38);
  pCVar4 = pRVar5->is_var_geq_times;
  get_arg((ArgVariant *)&local_100._tail,this,local_178);
  get_arg(&local_c8,this,(SyntaxTree *)local_108._M_pi);
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&local_100;
  std::
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  ::vector(&local_78,__l_01,&local_179);
  compile_command(this,pCVar4,&local_78,false);
  std::
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  ::~vector(&local_78);
  lVar6 = 0x38;
  do {
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
    ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
                *)((long)&local_100 + lVar6));
    lVar6 = lVar6 + -0x38;
  } while (lVar6 != -0x38);
  pCVar4 = (this->commands->goto_if_false).ref;
  if (pCVar4 != (Command *)0x0) {
    local_100._0_8_ = local_170._0_8_;
    local_100._8_8_ = local_170._8_8_;
    if ((Commands *)local_170._8_8_ != (Commands *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (((_Rb_tree_header *)(local_170._8_8_ + 8))->_M_header)._M_color =
             (((_Rb_tree_header *)(local_170._8_8_ + 8))->_M_header)._M_color + 1;
        UNLOCK();
      }
      else {
        (((_Rb_tree_header *)(local_170._8_8_ + 8))->_M_header)._M_color =
             (((_Rb_tree_header *)(local_170._8_8_ + 8))->_M_header)._M_color + 1;
      }
    }
    local_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x6;
    __l_02._M_len = 1;
    __l_02._M_array = (iterator)&local_100;
    std::
    vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
    ::vector(&local_90,__l_02,&local_179);
    compile_command(this,pCVar4,&local_90,false);
    std::
    vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
    ::~vector(&local_90);
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
    ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
                *)&local_100._tail);
    local_150._16_8_ = local_170._16_8_;
    local_138 = local_158;
    if (local_158 != (SymTable *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &(local_158->scripts)._M_t._M_impl.super__Rb_tree_header;
        (p_Var1->_M_header)._M_color = (p_Var1->_M_header)._M_color + 1;
        UNLOCK();
      }
      else {
        p_Var1 = &(local_158->scripts)._M_t._M_impl.super__Rb_tree_header;
        (p_Var1->_M_header)._M_color = (p_Var1->_M_header)._M_color + 1;
      }
    }
    std::vector<CompiledData,std::allocator<CompiledData>>::emplace_back<std::shared_ptr<Label>>
              ((vector<CompiledData,std::allocator<CompiledData>> *)this_00,
               (shared_ptr<Label> *)(local_150 + 0x10));
    if (local_138 != (SymTable *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138);
    }
    __p = (this->loop_stack).
          super__Vector_base<CompilerContext::LoopInfo,_std::allocator<CompilerContext::LoopInfo>_>.
          _M_impl.super__Vector_impl_data._M_finish + -1;
    (this->loop_stack).
    super__Vector_base<CompilerContext::LoopInfo,_std::allocator<CompilerContext::LoopInfo>_>.
    _M_impl.super__Vector_impl_data._M_finish = __p;
    __gnu_cxx::new_allocator<CompilerContext::LoopInfo>::destroy<CompilerContext::LoopInfo>
              ((new_allocator<CompilerContext::LoopInfo> *)local_110,__p);
    if ((Commands *)local_170._8_8_ != (Commands *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_);
    }
    if (local_158 != (SymTable *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_);
    }
    return;
  }
  __assert_fail("!\"ref\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/deps/optional/include/optional/optional.hpp"
                ,0x2ac,
                "auto std::experimental::optional<const Command &>::operator*()::(anonymous class)::operator()() const [T = const Command &]"
               );
}

Assistant:

void CompilerContext::compile_repeat(const SyntaxTree& repeat_node)
{
    auto& annotation = repeat_node.annotation<const RepeatAnnotation&>();
    auto& times = repeat_node.child(0);
    auto& var = repeat_node.child(1);

    auto continue_ptr = make_internal_label();
    auto break_ptr    = make_internal_label();
    auto loop_ptr     = make_internal_label();

    loop_stack.emplace_back(LoopInfo { continue_ptr, break_ptr });

    compile_command(annotation.set_var_to_zero, { get_arg(var), get_arg(annotation.number_zero) });
    compile_label(loop_ptr);
    compile_statements(repeat_node.child(2));
    compile_label(continue_ptr);
    compile_command(annotation.add_var_with_one, { get_arg(var), get_arg(annotation.number_one) });
    compile_command(annotation.is_var_geq_times, { get_arg(var), get_arg(times) });
    compile_command(*this->commands.goto_if_false, { loop_ptr });
    compile_label(break_ptr);

    loop_stack.pop_back();
}